

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

Expression * wasm::toABI(Expression *value,Module *module)

{
  BasicType BVar1;
  Unary *value_00;
  Expression *right;
  optional<wasm::Type> type;
  optional<wasm::Type> local_38;
  Type local_28;
  Builder local_20;
  Builder builder;
  Module *module_local;
  Expression *value_local;
  
  builder.wasm = module;
  Builder::Builder(&local_20,module);
  BVar1 = Type::getBasic(&value->type);
  module_local = (Module *)value;
  switch(BVar1) {
  case none:
    Type::Type(&local_28,i64);
    right = LiteralUtils::makeZero(local_28,builder.wasm);
    std::optional<wasm::Type>::optional(&local_38);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_38.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_38.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    module_local = (Module *)Builder::makeSequence(&local_20,value,right,type);
    break;
  case unreachable:
    break;
  case i32:
    module_local = (Module *)Builder::makeUnary(&local_20,ExtendUInt32,value);
    break;
  case i64:
    break;
  case f32:
    value_00 = Builder::makeUnary(&local_20,ReinterpretFloat32,value);
    module_local = (Module *)Builder::makeUnary(&local_20,ExtendUInt32,(Expression *)value_00);
    break;
  case f64:
    module_local = (Module *)Builder::makeUnary(&local_20,ReinterpretFloat64,value);
    break;
  case v128:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x3f);
  }
  return (Expression *)module_local;
}

Assistant:

static Expression* toABI(Expression* value, Module* module) {
  Builder builder(*module);
  switch (value->type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(ExtendUInt32, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ExtendUInt32,
                                builder.makeUnary(ReinterpretFloat32, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretFloat64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      // the value is none, but we need a value here
      value =
        builder.makeSequence(value, LiteralUtils::makeZero(Type::i64, *module));
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}